

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_data.cc
# Opt level: O0

int CRYPTO_set_ex_data(CRYPTO_EX_DATA *ad,int idx,void *val)

{
  stack_st_void *psVar1;
  size_t sVar2;
  ulong local_30;
  size_t i;
  void *val_local;
  int index_local;
  CRYPTO_EX_DATA *ad_local;
  
  if (idx < 0) {
    abort();
  }
  if (ad->sk == (stack_st_void *)0x0) {
    psVar1 = sk_void_new_null();
    ad->sk = (stack_st_void *)psVar1;
    if (ad->sk == (stack_st_void *)0x0) {
      return 0;
    }
  }
  local_30 = sk_void_num((stack_st_void *)ad->sk);
  while( true ) {
    if ((ulong)(long)idx < local_30) {
      sk_void_set((stack_st_void *)ad->sk,(long)idx,val);
      return 1;
    }
    sVar2 = sk_void_push((stack_st_void *)ad->sk,(void *)0x0);
    if (sVar2 == 0) break;
    local_30 = local_30 + 1;
  }
  return 0;
}

Assistant:

int CRYPTO_set_ex_data(CRYPTO_EX_DATA *ad, int index, void *val) {
  if (index < 0) {
    // A caller that can accidentally pass in an invalid index into this
    // function will hit an memory error if |index| happened to be valid, and
    // expected |val| to be of a different type.
    abort();
  }

  if (ad->sk == NULL) {
    ad->sk = sk_void_new_null();
    if (ad->sk == NULL) {
      return 0;
    }
  }

  // Add NULL values until the stack is long enough.
  for (size_t i = sk_void_num(ad->sk); i <= (size_t)index; i++) {
    if (!sk_void_push(ad->sk, NULL)) {
      return 0;
    }
  }

  sk_void_set(ad->sk, (size_t)index, val);
  return 1;
}